

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

void bk_lib::detail::fill<Potassco::RuleBuilder*>
               (RuleBuilder **first,RuleBuilder **last,RuleBuilder **x)

{
  RuleBuilder *pRVar1;
  
  switch((uint)((int)last - (int)first) >> 3 & 7) {
  case 0:
    for (; first != last; first = first + 1) {
      pRVar1 = *x;
      *first = pRVar1;
      first = first + 1;
LAB_001465b1:
      *first = pRVar1;
      first = first + 1;
switchD_0014658c_caseD_6:
      pRVar1 = *x;
      *first = pRVar1;
      first = first + 1;
LAB_001465c2:
      *first = pRVar1;
      first = first + 1;
switchD_0014658c_caseD_4:
      pRVar1 = *x;
      *first = pRVar1;
      first = first + 1;
LAB_001465d3:
      *first = pRVar1;
      first = first + 1;
switchD_0014658c_caseD_2:
      pRVar1 = *x;
      *first = pRVar1;
      first = first + 1;
LAB_001465e4:
      *first = pRVar1;
    }
    break;
  case 1:
    pRVar1 = *x;
    goto LAB_001465e4;
  case 2:
    goto switchD_0014658c_caseD_2;
  case 3:
    pRVar1 = *x;
    goto LAB_001465d3;
  case 4:
    goto switchD_0014658c_caseD_4;
  case 5:
    pRVar1 = *x;
    goto LAB_001465c2;
  case 6:
    goto switchD_0014658c_caseD_6;
  case 7:
    pRVar1 = *x;
    goto LAB_001465b1;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}